

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O1

void __thiscall
TPZManVector<TPZManVector<TFad<6,_double>,_3>,_3>::TPZManVector
          (TPZManVector<TPZManVector<TFad<6,_double>,_3>,_3> *this,int64_t size)

{
  undefined8 *puVar1;
  undefined1 auVar2 [16];
  double *pdVar3;
  int64_t *piVar4;
  int64_t iVar5;
  long lVar6;
  TPZManVector<TFad<6,_double>,_3> *pTVar7;
  long lVar8;
  ulong uVar9;
  int64_t *piVar10;
  
  (this->super_TPZVec<TPZManVector<TFad<6,_double>,_3>_>).fStore =
       (TPZManVector<TFad<6,_double>,_3> *)0x0;
  (this->super_TPZVec<TPZManVector<TFad<6,_double>,_3>_>).fNElements = 0;
  (this->super_TPZVec<TPZManVector<TFad<6,_double>,_3>_>).fNAlloc = 0;
  (this->super_TPZVec<TPZManVector<TFad<6,_double>,_3>_>)._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_0189f578;
  pdVar3 = &this->fExtAlloc[0].fExtAlloc[0].val_;
  lVar6 = 0x20;
  do {
    puVar1 = (undefined8 *)((long)this->fExtAlloc[0].fExtAlloc[0].dx_ + lVar6 + -0x48);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined8 *)((long)this->fExtAlloc[0].fExtAlloc[0].dx_ + lVar6 + -0x38) = 0;
    *(undefined ***)((long)(this->fExtAlloc[0].fExtAlloc + -1) + lVar6) =
         &PTR__TPZManVector_0189f520;
    lVar8 = 0;
    do {
      *(undefined ***)((long)pdVar3 + lVar8 + -8) = &PTR__TFad_0185d2b8;
      *(undefined8 *)((long)pdVar3 + lVar8) = 0;
      ((undefined8 *)((long)pdVar3 + lVar8))[1] = 0;
      puVar1 = (undefined8 *)((long)pdVar3 + lVar8 + 0x10);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)((long)pdVar3 + lVar8 + 0x20);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined8 *)((long)pdVar3 + lVar8 + 0x30) = 0;
      lVar8 = lVar8 + 0x40;
    } while (lVar8 != 0xc0);
    *(long *)((long)this->fExtAlloc[0].fExtAlloc[0].dx_ + lVar6 + -0x48) =
         (long)this->fExtAlloc[0].fExtAlloc[0].dx_ + lVar6 + -0x30;
    lVar8 = lVar6 + 0xe0;
    *(undefined8 *)((long)this->fExtAlloc[0].fExtAlloc[0].dx_ + lVar6 + -0x40) = 0;
    *(undefined8 *)((long)this->fExtAlloc[0].fExtAlloc[0].dx_ + lVar6 + -0x38) = 0;
    pdVar3 = pdVar3 + 0x1c;
    lVar6 = lVar8;
  } while (lVar8 != 0x2c0);
  if (size < 4) {
    pTVar7 = this->fExtAlloc;
    iVar5 = 0;
  }
  else {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = size;
    uVar9 = 0xffffffffffffffff;
    if (SUB168(auVar2 * ZEXT816(0xe0),8) == 0) {
      uVar9 = SUB168(auVar2 * ZEXT816(0xe0),0) | 8;
    }
    piVar4 = (int64_t *)operator_new__(uVar9);
    *piVar4 = size;
    pTVar7 = (TPZManVector<TFad<6,_double>,_3> *)(piVar4 + 1);
    lVar6 = 8;
    piVar10 = piVar4;
    do {
      puVar1 = (undefined8 *)((long)piVar4 + lVar6 + 8);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined8 *)((long)piVar4 + lVar6 + 0x18) = 0;
      *(undefined ***)((long)piVar4 + lVar6) = &PTR__TPZManVector_0189f520;
      lVar8 = 0x30;
      do {
        *(undefined ***)((long)piVar10 + lVar8 + -8) = &PTR__TFad_0185d2b8;
        *(undefined8 *)((long)piVar10 + lVar8) = 0;
        ((undefined8 *)((long)piVar10 + lVar8))[1] = 0;
        puVar1 = (undefined8 *)((long)piVar10 + lVar8 + 0x10);
        *puVar1 = 0;
        puVar1[1] = 0;
        puVar1 = (undefined8 *)((long)piVar10 + lVar8 + 0x20);
        *puVar1 = 0;
        puVar1[1] = 0;
        *(undefined8 *)((long)piVar10 + lVar8 + 0x30) = 0;
        lVar8 = lVar8 + 0x40;
      } while (lVar8 != 0xf0);
      *(long *)((long)piVar4 + lVar6 + 8) = (long)piVar4 + lVar6 + 0x20;
      lVar8 = lVar6 + 0xe0;
      *(undefined8 *)((long)piVar4 + lVar6 + 0x10) = 0;
      *(undefined8 *)((long)piVar4 + lVar6 + 0x18) = 0;
      piVar10 = piVar10 + 0x1c;
      iVar5 = size;
      lVar6 = lVar6 + 0xe0;
    } while ((int64_t *)((long)piVar4 + lVar8) != piVar4 + size * 0x1c + 1);
  }
  (this->super_TPZVec<TPZManVector<TFad<6,_double>,_3>_>).fStore = pTVar7;
  (this->super_TPZVec<TPZManVector<TFad<6,_double>,_3>_>).fNElements = size;
  (this->super_TPZVec<TPZManVector<TFad<6,_double>,_3>_>).fNAlloc = iVar5;
  return;
}

Assistant:

TPZManVector< T, NumExtAlloc >::TPZManVector(const int64_t size) :
TPZVec<T>(0) // There is always some static allocation.
{
    /* If the size requested fits inside the size already provided
     * statically, provides access to that space, by setting some
     * TPZVec data.
     */
    if (size <= NumExtAlloc) {
        // Needed to make TPZVec::operator[] work properly.
        this->fStore = fExtAlloc;
        this->fNElements = size;
        // No memory was allocated by the constructor.
        this->fNAlloc = 0;
    } else // The size requested is bigger than the size already provided.
    {
        // Executes the allocation that would be done by TPZVec<T>(size).
        this->fStore = new T[ size ];
        this->fNElements = size;
        this->fNAlloc = size;
    }
}